

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4e9173::CNNConvolveTest::RunCNNConvolveSetup(CNNConvolveTest *this,int run_times)

{
  float fVar1;
  uint uVar2;
  int in_width;
  CNNConvolveTest *pCVar3;
  uint32_t uVar4;
  float *pfVar5;
  int64_t iVar6;
  int64_t iVar7;
  Message *pMVar8;
  int iVar9;
  float *pfVar10;
  int iVar11;
  long lVar12;
  size_t size;
  SEARCH_METHODS *pSVar13;
  CNN_LAYER_CONFIG *layer_config;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  bool bVar18;
  AssertHelper local_2d0;
  AssertionResult gtest_ar_3;
  int out_width;
  int out_height;
  ulong local_2a8;
  CNN_LAYER_CONFIG *local_2a0;
  int local_294;
  ulong local_290;
  float *temp_ptr;
  AssertionResult gtest_ar;
  float *out_data_mod;
  float *out_data_ref;
  AssertHelper local_248;
  int local_240;
  float relative_error;
  long local_238;
  CNNConvolveTest *local_230;
  long local_228;
  float *local_220;
  float *output_mod [20];
  float *output_ref [20];
  float *input [20];
  
  local_294 = 0;
  if (0 < run_times) {
    local_294 = run_times;
  }
  iVar9 = 0x41;
  lVar12 = 0;
  in_width = 0x41;
  local_240 = run_times;
  local_230 = this;
  while( true ) {
    if (lVar12 == 5) {
      return;
    }
    out_width = 0;
    out_height = 0;
    iVar16 = iVar9 * in_width;
    layer_config = av1_intra_mode_cnn_partition_cnn_config.layer_config + lVar12;
    av1_find_cnn_layer_output_size(in_width,iVar9,layer_config,&out_width,&out_height);
    local_2a8 = (ulong)(uint)(out_height * out_width);
    uVar2 = layer_config->in_channels;
    local_2a0 = layer_config;
    temp_ptr = (float *)aom_malloc((long)iVar16 * (long)(int)uVar2 * 4);
    gtest_ar_3.success_ = false;
    gtest_ar_3._1_7_ = 0;
    local_220 = temp_ptr;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              ((internal *)&gtest_ar,"temp_ptr","nullptr",&temp_ptr,(void **)&gtest_ar_3);
    if (gtest_ar.success_ == false) break;
    local_238 = lVar12;
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    if (iVar16 < 1) {
      iVar16 = 0;
    }
    uVar15 = 0;
    if (0 < (int)uVar2) {
      uVar15 = (ulong)uVar2;
    }
    local_228 = (long)(int)uVar2;
    for (uVar14 = 0; uVar14 != uVar15; uVar14 = uVar14 + 1) {
      input[uVar14] = temp_ptr;
      iVar11 = iVar16;
      while (bVar18 = iVar11 != 0, iVar11 = iVar11 + -1, bVar18) {
        uVar4 = libaom_test::ACMRandom::Rand31(&this->rng_);
        *temp_ptr = ((float)uVar4 + -1.0737418e+09) * 4.656613e-10;
        temp_ptr = temp_ptr + 1;
      }
    }
    local_290 = (ulong)(uint)local_2a0->out_channels;
    size = (size_t)(local_2a0->out_channels * (int)local_2a8);
    out_data_ref = (float *)aom_calloc(4,size);
    gtest_ar_3.success_ = false;
    gtest_ar_3._1_7_ = 0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              ((internal *)&gtest_ar,"out_data_ref","nullptr",&out_data_ref,(void **)&gtest_ar_3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_3);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)
                   gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x9fd,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&gtest_ar_3);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      if (gtest_ar_3._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
      goto LAB_0047bacb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    out_data_mod = (float *)aom_calloc(4,size);
    gtest_ar_3.success_ = false;
    gtest_ar_3._1_7_ = 0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              ((internal *)&gtest_ar,"out_data_mod","nullptr",&out_data_mod,(void **)&gtest_ar_3);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar_3);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)
                   gtest_ar.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0xa01,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&gtest_ar_3);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      if (gtest_ar_3._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
      }
      goto LAB_0047bacb;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar.message_);
    pCVar3 = local_230;
    iVar16 = out_width;
    uVar15 = 0;
    if (0 < (int)local_290) {
      uVar15 = local_290 & 0xffffffff;
    }
    pfVar5 = out_data_ref;
    pfVar10 = out_data_mod;
    for (uVar14 = 0; uVar15 != uVar14; uVar14 = uVar14 + 1) {
      output_ref[uVar14] = pfVar5;
      output_mod[uVar14] = pfVar10;
      pfVar5 = pfVar5 + (int)local_2a8;
      pfVar10 = pfVar10 + (int)local_2a8;
    }
    iVar17 = (int)local_228 * (int)local_290;
    ::aom_usec_timer_start((aom_usec_timer *)&gtest_ar);
    iVar11 = local_294;
    while (bVar18 = iVar11 != 0, iVar11 = iVar11 + -1, bVar18) {
      (*(pCVar3->params_).ref_func)
                (input,iVar9,in_width,iVar9,local_2a0,output_ref,iVar16,0,iVar17,1);
    }
    ::aom_usec_timer_mark((aom_usec_timer *)&gtest_ar);
    iVar6 = ::aom_usec_timer_elapsed((aom_usec_timer *)&gtest_ar);
    ::aom_usec_timer_start((aom_usec_timer *)&gtest_ar);
    iVar11 = local_294;
    while (bVar18 = iVar11 != 0, iVar11 = iVar11 + -1, bVar18) {
      (*(pCVar3->params_).tst_func)
                (input,iVar9,in_width,iVar9,local_2a0,output_mod,iVar16,0,iVar17,1);
    }
    ::aom_usec_timer_mark((aom_usec_timer *)&gtest_ar);
    if (local_240 < 2) {
      iVar9 = (int)local_2a8;
      local_2a8 = local_2a8 & 0xffffffff;
      if (iVar9 < 1) {
        local_2a8 = 0;
      }
      iVar9 = (int)local_290;
      local_290 = local_290 & 0xffffffff;
      if (iVar9 < 1) {
        local_290 = 0;
      }
      for (uVar15 = 0; uVar15 != local_290; uVar15 = uVar15 + 1) {
        pfVar5 = output_ref[uVar15];
        pfVar10 = output_mod[uVar15];
        for (uVar14 = 0; local_2a8 != uVar14; uVar14 = uVar14 + 1) {
          fVar1 = *pfVar5;
          if (0.001 <= fVar1) {
            relative_error = ABS((fVar1 - *pfVar10) / fVar1);
            local_2d0.data_._0_4_ = 0x3a83126f;
            testing::internal::CmpHelperLE<float,float>
                      ((internal *)&gtest_ar_3,"relative_error","1E-3f",&relative_error,
                       (float *)&local_2d0);
            if (gtest_ar_3.success_ == false) {
              testing::Message::Message((Message *)&local_2d0);
              std::operator<<((ostream *)
                              (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                              " channel ");
              std::ostream::operator<<
                        ((void *)(CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                         (int)uVar15);
              std::operator<<((ostream *)
                              (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                              " pixel ");
              std::ostream::operator<<
                        ((void *)(CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                         (int)uVar14);
              std::operator<<((ostream *)
                              (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),": ");
              pMVar8 = testing::Message::operator<<((Message *)&local_2d0,pfVar5);
              pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [2])0xc31319);
              pMVar8 = testing::Message::operator<<(pMVar8,pfVar10);
              std::endl<char,std::char_traits<char>>
                        ((ostream *)
                         ((pMVar8->ss_)._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 0x10));
              pSVar13 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar13 = *(SEARCH_METHODS **)
                           gtest_ar_3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_248,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                         ,0xa44,(char *)pSVar13);
              testing::internal::AssertHelper::operator=(&local_248,pMVar8);
              testing::internal::AssertHelper::~AssertHelper(&local_248);
              if ((long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 8))();
              }
              goto LAB_0047b94f;
            }
          }
          else {
            local_2d0.data_._0_4_ = 0x3a83126f;
            testing::internal::CmpHelperLE<float,float>
                      ((internal *)&gtest_ar_3,"buf_ref[i]","1E-3f",pfVar5,(float *)&local_2d0);
            if (gtest_ar_3.success_ == false) {
              testing::Message::Message((Message *)&local_2d0);
              std::operator<<((ostream *)
                              (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                              "Reference output was near-zero, test output was not (");
              pMVar8 = testing::Message::operator<<((Message *)&local_2d0,pfVar10);
              pMVar8 = testing::Message::operator<<(pMVar8,(char (*) [2])0xaa987d);
              pSVar13 = "";
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar_3.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pSVar13 = *(SEARCH_METHODS **)
                           gtest_ar_3.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_248,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                         ,0xa3e,(char *)pSVar13);
              testing::internal::AssertHelper::operator=(&local_248,pMVar8);
              testing::internal::AssertHelper::~AssertHelper(&local_248);
              if ((long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 8))();
              }
LAB_0047b94f:
              std::
              unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~unique_ptr(&gtest_ar_3.message_);
              goto LAB_0047b954;
            }
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_3.message_);
          pfVar10 = pfVar10 + 1;
          pfVar5 = pfVar5 + 1;
        }
      }
    }
    else {
      iVar7 = ::aom_usec_timer_elapsed((aom_usec_timer *)&gtest_ar);
      local_2a0 = (CNN_LAYER_CONFIG *)(double)iVar7;
      printf("layer : %d \n",local_238);
      printf("%7.2f/%7.2fns (%3.2f)\n",(double)iVar6,local_2a0,(double)iVar6 / (double)local_2a0);
    }
LAB_0047b954:
    in_width = out_height;
    iVar9 = out_width;
    aom_free(local_220);
    aom_free(out_data_ref);
    aom_free(out_data_mod);
    lVar12 = local_238 + 1;
  }
  testing::Message::Message((Message *)&gtest_ar_3);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    pSVar13 = "";
  }
  else {
    pSVar13 = *(SEARCH_METHODS **)
               gtest_ar.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl;
  }
  testing::internal::AssertHelper::AssertHelper
            (&local_2d0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
             ,0x9f2,(char *)pSVar13);
  testing::internal::AssertHelper::operator=(&local_2d0,(Message *)&gtest_ar_3);
  testing::internal::AssertHelper::~AssertHelper(&local_2d0);
  if (gtest_ar_3._0_8_ != 0) {
    (**(code **)(*(long *)gtest_ar_3._0_8_ + 8))();
  }
LAB_0047bacb:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void RunCNNConvolveSetup(int run_times) {
    int in_width = 65;
    int in_height = 65;

    const CNN_CONFIG *cnn_config = &av1_intra_mode_cnn_partition_cnn_config;

    for (int layer = 0; layer < cnn_config->num_layers; ++layer) {
      int out_width = 0, out_height = 0;
      int in_size = in_width * in_height;
      // Get current layer output width and height.
      av1_find_cnn_layer_output_size(in_height, in_width,
                                     &cnn_config->layer_config[layer],
                                     &out_width, &out_height);

      int out_size = out_width * out_height;
      float *input[20], *output_ref[20], *output_mod[20];

      float *input_data =
          (float *)aom_malloc(sizeof(*input_data) * in_size *
                              cnn_config->layer_config[layer].in_channels);
      float *temp_ptr = input_data;
      ASSERT_NE(temp_ptr, nullptr);
      for (int i = 0; i < cnn_config->layer_config[layer].in_channels; ++i) {
        input[i] = temp_ptr;
        for (int j = 0; j < in_size; j++) {
          *(temp_ptr++) = ((float)rng_.Rand31() - (1 << 30)) / (1u << 31);
        }
      }

      float *out_data_ref = (float *)aom_calloc(
          sizeof(*out_data_ref),
          out_size * cnn_config->layer_config[layer].out_channels);
      ASSERT_NE(out_data_ref, nullptr);
      float *out_data_mod = (float *)aom_calloc(
          sizeof(*out_data_mod),
          out_size * cnn_config->layer_config[layer].out_channels);
      ASSERT_NE(out_data_mod, nullptr);
      float *temp_ptr1 = out_data_ref;
      float *temp_ptr2 = out_data_mod;
      for (int i = 0; i < cnn_config->layer_config[layer].out_channels; ++i) {
        output_ref[i] = temp_ptr1;
        output_mod[i] = temp_ptr2;
        temp_ptr1 += out_size;
        temp_ptr2 += out_size;
      }

      RunCNNConvolveTest(input, in_width, in_height, out_size,
                         &cnn_config->layer_config[layer], 0, 1, run_times,
                         layer, output_ref, output_mod, out_width);

      // Set current layer output width and height as next layer input width and
      // height.
      in_width = out_width;
      in_height = out_height;

      aom_free(input_data);
      aom_free(out_data_ref);
      aom_free(out_data_mod);
    }
  }